

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode inflate_stream(Curl_easy *data,Curl_cwriter *writer,int type,zlibInitState started)

{
  int iVar1;
  Curl_cwriter *pCVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_cwriter **z_00;
  CURLcode local_50;
  int status;
  CURLcode result;
  _Bool done;
  Bytef *orig_in;
  uInt nread;
  z_stream *z;
  zlib_writer *zp;
  zlibInitState started_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  z_00 = &writer[0x201].next;
  iVar1 = *(int *)&writer[0x201].ctx;
  pCVar2 = *z_00;
  bVar3 = false;
  local_50 = CURLE_OK;
  if (((*(int *)&writer[1].cwt == 1) || (*(int *)&writer[1].cwt == 2)) ||
     (*(int *)&writer[1].cwt == 4)) {
LAB_00127791:
    if (!bVar3) {
      bVar3 = true;
      writer[0x202].cwt = (Curl_cwtype *)((long)&writer[1].cwt + 4);
      *(undefined4 *)&writer[0x202].next = 0x4000;
      iVar4 = inflate(z_00,5);
      if ((*(int *)&writer[0x202].next != 0x4000) && ((iVar4 == 0 || (iVar4 == 1)))) {
        *(zlibInitState *)&writer[1].cwt = started;
        local_50 = Curl_cwriter_write(data,writer->next,type,(char *)((long)&writer[1].cwt + 4),
                                      (ulong)(0x4000 - *(int *)&writer[0x202].next));
        if (local_50 != CURLE_OK) {
          exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),local_50);
          goto LAB_00127980;
        }
      }
      switch(iVar4) {
      case 0:
        bVar3 = false;
        break;
      case 1:
        local_50 = process_trailer(data,(zlib_writer *)writer);
        break;
      case -5:
        break;
      default:
        CVar5 = process_zlib_error(data,(z_stream *)z_00);
        local_50 = exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CVar5);
        break;
      case -3:
        if (*(int *)&writer[1].cwt == 1) {
          iVar4 = inflateReset2(z_00,0xfffffff1);
          if (iVar4 == 0) {
            *z_00 = pCVar2;
            *(int *)&writer[0x201].ctx = iVar1;
            *(undefined4 *)&writer[1].cwt = 2;
            *(undefined4 *)((long)&writer[0x201].cwt + 4) = 4;
            bVar3 = false;
            break;
          }
          *(undefined4 *)&writer[1].cwt = 0;
        }
        CVar5 = process_zlib_error(data,(z_stream *)z_00);
        local_50 = exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CVar5);
        break;
      }
      goto LAB_00127791;
    }
LAB_00127980:
    if ((iVar1 != 0) && (*(int *)&writer[1].cwt == 1)) {
      *(zlibInitState *)&writer[1].cwt = started;
    }
    data_local._4_4_ = local_50;
  }
  else {
    data_local._4_4_ =
         exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CURLE_WRITE_ERROR);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode inflate_stream(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               zlibInitState started)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  z_const Bytef *orig_in = z->next_in;
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via next_write function. */
  while(!done) {
    int status;                   /* zlib status */
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) zp->buffer;
    z->avail_out = DECOMPRESS_BUFFER_SIZE;

    status = inflate(z, Z_BLOCK);

    /* Flush output data if some. */
    if(z->avail_out != DECOMPRESS_BUFFER_SIZE) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_cwriter_write(data, writer->next, type, zp->buffer,
                                    DECOMPRESS_BUFFER_SIZE - z->avail_out);
        if(result) {
          exit_zlib(data, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(data, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        if(inflateReset2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          zp->trailerlen = 4; /* Tolerate up to 4 unknown trailer bytes. */
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    default:
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    }
  }

  /* We are about to leave this call so the `nread' data bytes will not be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}